

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_descriptor.c
# Opt level: O3

void plugin_descriptor_destroy(plugin_descriptor descriptor)

{
  if (descriptor != (plugin_descriptor)0x0) {
    dynlink_unload(descriptor->handle);
    if (descriptor->library_name != (char *)0x0) {
      free(descriptor->library_name);
    }
    if (descriptor->symbol_iface_name != (char *)0x0) {
      free(descriptor->symbol_iface_name);
    }
    free(descriptor);
    return;
  }
  return;
}

Assistant:

void plugin_descriptor_destroy(plugin_descriptor descriptor)
{
	if (descriptor != NULL)
	{
		dynlink_unload(descriptor->handle);

		if (descriptor->library_name != NULL)
		{
			free(descriptor->library_name);
		}

		if (descriptor->symbol_iface_name != NULL)
		{
			free(descriptor->symbol_iface_name);
		}

		free(descriptor);
	}
}